

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dobjtype.cpp
# Opt level: O0

size_t __thiscall PStruct::PropagateMark(PStruct *this)

{
  uint uVar1;
  size_t sVar2;
  PStruct *this_local;
  
  GC::MarkArray<PField*>(&this->Fields);
  uVar1 = TArray<PField_*,_PField_*>::Size(&this->Fields);
  sVar2 = PType::PropagateMark((PType *)this);
  return (ulong)uVar1 * 8 + sVar2;
}

Assistant:

size_t PStruct::PropagateMark()
{
	GC::MarkArray(Fields);
	return Fields.Size() * sizeof(void*) + Super::PropagateMark();
}